

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::Config::from_file
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          Config *this,string *name)

{
  pointer pcVar1;
  FileError *__return_storage_ptr___00;
  ifstream input;
  string local_250;
  long local_230 [4];
  int aiStack_210 [122];
  
  ::std::ifstream::ifstream(local_230,(string *)name,_S_in);
  if (*(int *)((long)aiStack_210 + *(long *)(local_230[0] + -0x18)) == 0) {
    (*this->_vptr_Config[1])(__return_storage_ptr__,this,local_230);
    ::std::ifstream::~ifstream(local_230);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (FileError *)__cxa_allocate_exception(0x38);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar1,pcVar1 + name->_M_string_length);
  FileError::Missing(__return_storage_ptr___00,&local_250);
  __cxa_throw(__return_storage_ptr___00,&FileError::typeinfo,Error::~Error);
}

Assistant:

std::vector<ConfigItem> from_file(const std::string &name) {
        std::ifstream input{name};
        if(!input.good())
            throw FileError::Missing(name);

        return from_config(input);
    }